

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O1

void __thiscall CPP::WriteInitialization::acceptAction(WriteInitialization *this,DomAction *node)

{
  Driver *pDVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  iterator iVar6;
  iterator iVar7;
  QTextStream *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QString local_a8;
  QString local_88;
  QString local_68;
  DomPropertyList local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->m_has_attr_menu == false) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    Driver::findOrInsertAction(&local_68,this->m_driver,node);
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar1 = this->m_driver;
    iVar6 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget(&local_88,pDVar1,iVar6.i[-1]);
    iVar7 = QList<DomActionGroup_*>::end(&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
    if (iVar7.i[-1] != (DomActionGroup *)0x0) {
      pDVar1 = this->m_driver;
      iVar7 = QList<DomActionGroup_*>::end
                        (&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
      Driver::findOrInsertActionGroup((QString *)&local_48,pDVar1,iVar7.i[-1]);
      qVar5 = local_48.d.size;
      pDVar4 = local_48.d.d;
      pcVar3 = local_88.d.ptr;
      pDVar2 = local_88.d.d;
      local_48.d.d = (Data *)local_88.d.d;
      local_88.d.d = (Data *)pDVar4;
      local_88.d.ptr = (char16_t *)local_48.d.ptr;
      local_48.d.ptr = (DomProperty **)pcVar3;
      local_48.d.size = local_88.d.size;
      local_88.d.size = qVar5;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&local_68);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," = ");
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&language::operatorNew);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"QAction(");
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,&local_88);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,')');
    QTextStream::operator<<(pQVar8,(QString *)&language::eol);
    QVar9.m_data = &DAT_00000007;
    QVar9.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar9);
    local_a8.d.d = (Data *)local_48.d.d;
    local_a8.d.ptr = (char16_t *)local_48.d.ptr;
    local_a8.d.size = local_48.d.size;
    local_48.d.d = (node->m_property).d.d;
    local_48.d.ptr = (node->m_property).d.ptr;
    local_48.d.size = (node->m_property).d.size;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeProperties(this,&local_68,&local_a8,&local_48,0);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::acceptAction(DomAction *node)
{
    if (node->hasAttributeMenu())
        return;

    const QString actionName = m_driver->findOrInsertAction(node);
    QString varName = m_driver->findOrInsertWidget(m_widgetChain.top());

    if (m_actionGroupChain.top())
        varName = m_driver->findOrInsertActionGroup(m_actionGroupChain.top());

    m_output << m_indent << actionName << " = " << language::operatorNew
        << "QAction(" << varName << ')' << language::eol;
    writeProperties(actionName, "QAction"_L1, node->elementProperty());
}